

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *type_info,
                 type_info *type_info_backup,_func_void_ptr_void_ptr *copy_constructor,
                 _func_void_ptr_void_ptr *move_constructor,void *existing_holder)

{
  byte bVar1;
  type_info *ptVar2;
  byte bVar3;
  internals *this;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> _Var4;
  type_info *ptVar5;
  handle hVar6;
  void *pvVar7;
  cast_error *this_00;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> extraout_RDX;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> _Var9;
  PyObject *pPVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  pVar11;
  void *src;
  _func_void_ptr_void_ptr *local_78;
  object inst;
  string msg;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> _Var8;
  
  src = _src;
  if (_src == (void *)0x0) {
    hVar6.m_ptr = (PyObject *)&_Py_NoneStruct;
    inst.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 2;
    goto LAB_0014e00e;
  }
  this = get_internals();
  inst.super_handle.m_ptr = (handle)(handle)type_info;
  _Var4._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,(key_type *)&inst);
  if ((_Var4._M_cur == (__node_type *)0x0) &&
     (inst.super_handle.m_ptr = (handle)(handle)type_info_backup,
     _Var4._M_cur = (__node_type *)
                    std::
                    _Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)this,(key_type *)&inst), _Var4._M_cur == (__node_type *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inst,
               *(char **)(type_info_backup + 8) + (**(char **)(type_info_backup + 8) == '*'),
               (allocator<char> *)&msg);
    clean_type_id((string *)&inst);
    std::operator+(&msg,"Unregistered type : ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inst);
    PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&inst);
    return (handle)(PyObject *)0x0;
  }
  ptVar2 = *(type_info **)
            ((long)&((_Var4._M_cur)->
                    super__Hash_node_value<std::pair<const_std::type_index,_void_*>,_false>).
                    super__Hash_node_value_base<std::pair<const_std::type_index,_void_*>_>.
                    _M_storage._M_storage + 8);
  local_78 = copy_constructor;
  pVar11 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(this->registered_instances)._M_h,&src);
  _Var8 = pVar11.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
          _M_cur;
  while (_Var9._M_cur = (__node_type *)
                        pVar11.first.
                        super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
                        _M_cur,
        (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)_Var9._M_cur !=
        _Var8.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur) {
    ptVar5 = get_type_info(*(PyTypeObject **)
                            (*(long *)((long)&((_Var9._M_cur)->
                                              super__Hash_node_value<std::pair<const_void_*const,_void_*>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_void_*const,_void_*>_>
                                              ._M_storage._M_storage + 8) + 8));
    if ((ptVar5 != (type_info *)0x0) && (ptVar5 == ptVar2)) {
      pPVar10 = *(PyObject **)
                 ((long)&((_Var9._M_cur)->
                         super__Hash_node_value<std::pair<const_void_*const,_void_*>,_false>).
                         super__Hash_node_value_base<std::pair<const_void_*const,_void_*>_>.
                         _M_storage._M_storage + 8);
      if (pPVar10 == (PyObject *)0x0) {
        return (handle)(PyObject *)0x0;
      }
      pPVar10->ob_refcnt = pPVar10->ob_refcnt + 1;
      return (handle)pPVar10;
    }
    pVar11.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur =
         extraout_RDX.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur;
    pVar11.first.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)
         (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)
         ((_Var9._M_cur)->super__Hash_node_base)._M_nxt;
  }
  hVar6.m_ptr = (PyObject *)PyType_GenericAlloc(ptVar2->type,0);
  hVar6.m_ptr[1].ob_refcnt = 0;
  bVar1 = (byte)hVar6.m_ptr[2].ob_refcnt;
  bVar3 = bVar1 & 0xfe;
  *(byte *)&hVar6.m_ptr[2].ob_refcnt = bVar3;
  inst.super_handle.m_ptr = (handle)(handle)hVar6.m_ptr;
  if (reference_internal < policy) {
    this_00 = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this_00,"unhandled return_value_policy: should not happen!");
LAB_0014e077:
    __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pPVar10 = hVar6.m_ptr + 1;
  switch(policy) {
  default:
    pPVar10->ob_refcnt = (Py_ssize_t)src;
    bVar3 = bVar1 | 1;
    break;
  case automatic_reference:
  case reference:
    pPVar10->ob_refcnt = (Py_ssize_t)src;
    break;
  case copy:
    if (local_78 == (_func_void_ptr_void_ptr *)0x0) {
      this_00 = (cast_error *)__cxa_allocate_exception(0x10);
      cast_error::runtime_error
                (this_00,"return_value_policy = copy, but the object is non-copyable!");
      goto LAB_0014e077;
    }
    pvVar7 = (*local_78)(src);
    goto LAB_0014dfd3;
  case move:
    if ((move_constructor == (_func_void_ptr_void_ptr *)0x0) &&
       (move_constructor = local_78, local_78 == (_func_void_ptr_void_ptr *)0x0)) {
      this_00 = (cast_error *)__cxa_allocate_exception(0x10);
      cast_error::runtime_error
                (this_00,
                 "return_value_policy = move, but the object is neither movable nor copyable!");
      goto LAB_0014e077;
    }
    pvVar7 = (*move_constructor)(src);
LAB_0014dfd3:
    hVar6.m_ptr[1].ob_refcnt = (Py_ssize_t)pvVar7;
    bVar3 = (byte)hVar6.m_ptr[2].ob_refcnt | 1;
    break;
  case reference_internal:
    hVar6.m_ptr[1].ob_refcnt = (Py_ssize_t)src;
    *(byte *)&hVar6.m_ptr[2].ob_refcnt = bVar3;
    keep_alive_impl(hVar6,parent);
    goto LAB_0014dfe1;
  }
  *(byte *)&hVar6.m_ptr[2].ob_refcnt = bVar3;
LAB_0014dfe1:
  (*ptVar2->init_holder)((PyObject *)inst.super_handle.m_ptr,existing_holder);
  std::
  _Hashtable<void_const*,std::pair<void_const*const,void*>,std::allocator<std::pair<void_const*const,void*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<void*&,_object*&>
            ((_Hashtable<void_const*,std::pair<void_const*const,void*>,std::allocator<std::pair<void_const*const,void*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&this->registered_instances,pPVar10,&inst);
  hVar6 = inst.super_handle.m_ptr;
  inst.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_0014e00e:
  object::~object(&inst);
  return (handle)hVar6.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const std::type_info *type_info,
                                         const std::type_info *type_info_backup,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().inc_ref();

        auto &internals = get_internals();

        auto it = internals.registered_types_cpp.find(std::type_index(*type_info));
        if (it == internals.registered_types_cpp.end()) {
            type_info = type_info_backup;
            it = internals.registered_types_cpp.find(std::type_index(*type_info));
        }

        if (it == internals.registered_types_cpp.end()) {
            std::string tname = type_info->name();
            detail::clean_type_id(tname);
            std::string msg = "Unregistered type : " + tname;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return handle();
        }

        auto tinfo = (const detail::type_info *) it->second;

        auto it_instances = internals.registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            auto instance_type = detail::get_type_info(Py_TYPE(it_i->second));
            if (instance_type && instance_type == tinfo)
                return handle((PyObject *) it_i->second).inc_ref();
        }

        auto inst = reinterpret_steal<object>(PyType_GenericAlloc(tinfo->type, 0));

        auto wrapper = (instance<void> *) inst.ptr();

        wrapper->value = nullptr;
        wrapper->owned = false;

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                wrapper->value = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                wrapper->value = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    wrapper->value = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = copy, but the "
                                     "object is non-copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    wrapper->value = move_constructor(src);
                else if (copy_constructor)
                    wrapper->value = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = move, but the "
                                     "object is neither movable nor copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                wrapper->value = src;
                wrapper->owned = false;
                detail::keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_holder(inst.ptr(), existing_holder);

        internals.registered_instances.emplace(wrapper->value, inst.ptr());

        return inst.release();
    }